

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_aes128gcm(void)

{
  ptls_cipher_suite_t *cs1;
  ptls_cipher_suite_t *cs2;
  
  cs1 = find_aes128gcmsha256(ctx);
  cs2 = find_aes128gcmsha256(ctx_peer);
  test_ciphersuite(cs1,cs2);
  return;
}

Assistant:

static void test_aes128gcm(void)
{
    test_ciphersuite(find_aes128gcmsha256(ctx), find_aes128gcmsha256(ctx_peer));
}